

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::CumulativeReporterBase::~CumulativeReporterBase(CumulativeReporterBase *this)

{
  code *pcVar1;
  CumulativeReporterBase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

CumulativeReporterBase::~CumulativeReporterBase() {}